

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void SettingsHandlerWindow_ReadLine
               (ImGuiContext *param_1,ImGuiSettingsHandler *param_2,void *entry,char *line)

{
  ImVec2 IVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float y;
  float x;
  int i;
  float local_1c;
  float local_18;
  int local_14;
  
  iVar2 = __isoc99_sscanf(line,"Pos=%f,%f",&local_18,&local_1c);
  if (iVar2 == 2) {
    *(float *)((long)entry + 0xc) = local_18;
    *(float *)((long)entry + 0x10) = local_1c;
  }
  else {
    iVar2 = __isoc99_sscanf(line,"Size=%f,%f",&local_18,&local_1c);
    if (iVar2 == 2) {
      IVar1 = (GImGui->Style).WindowMinSize;
      fVar5 = IVar1.x;
      fVar6 = IVar1.y;
      uVar3 = -(uint)(fVar5 <= local_18);
      uVar4 = -(uint)(fVar6 <= local_1c);
      *(ulong *)((long)entry + 0x14) =
           CONCAT44(~uVar4 & (uint)fVar6,~uVar3 & (uint)fVar5) |
           CONCAT44((uint)local_1c & uVar4,(uint)local_18 & uVar3);
    }
    else {
      iVar2 = __isoc99_sscanf(line,"Collapsed=%d",&local_14);
      if (iVar2 == 1) {
        *(bool *)((long)entry + 0x1c) = local_14 != 0;
      }
    }
  }
  return;
}

Assistant:

static void SettingsHandlerWindow_ReadLine(ImGuiContext*, ImGuiSettingsHandler*, void* entry, const char* line)
{
    ImGuiWindowSettings* settings = (ImGuiWindowSettings*)entry;
    float x, y;
    int i;
    if (sscanf(line, "Pos=%f,%f", &x, &y) == 2)         settings->Pos = ImVec2(x, y);
    else if (sscanf(line, "Size=%f,%f", &x, &y) == 2)   settings->Size = ImMax(ImVec2(x, y), GImGui->Style.WindowMinSize);
    else if (sscanf(line, "Collapsed=%d", &i) == 1)     settings->Collapsed = (i != 0);
}